

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

void __thiscall hta::storage::file::Metric::flush(Metric *this)

{
  _Base_ptr p_Var1;
  
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::flush(&this->file_raw_);
  for (p_Var1 = (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::flush
              ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)&p_Var1[1]._M_parent)
    ;
  }
  return;
}

Assistant:

void Metric::flush()
{
    file_raw().flush();
    for (auto& elem : files_hta_)
    {
        elem.second.flush();
    }
}